

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

void vector_insert_empty(vector v,size_t position)

{
  int iVar1;
  void *__dest;
  void *__src;
  size_t in_RSI;
  vector in_RDI;
  
  if (in_RDI != (vector)0x0) {
    if ((in_RDI->size == in_RDI->capacity) && (iVar1 = vector_reserve(in_RDI,in_RSI), iVar1 != 0)) {
      log_write_impl_va("metacall",0x18e,"vector_insert_empty",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector reserve error");
    }
    if (in_RSI < in_RDI->size) {
      __dest = vector_data_offset_bytes(in_RDI,in_RSI * in_RDI->type_size);
      __src = vector_data_offset_bytes(in_RDI,(in_RSI + 1) * in_RDI->type_size);
      memmove(__dest,__src,(in_RDI->size - in_RSI) * in_RDI->type_size);
    }
    in_RDI->size = in_RDI->size + 1;
  }
  return;
}

Assistant:

void vector_insert_empty(vector v, size_t position)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		if (position < v->size)
		{
			memmove(vector_data_offset_bytes(v, position * v->type_size),
				vector_data_offset_bytes(v, (position + 1) * v->type_size),
				(v->size - position) * v->type_size);
		}

		++v->size;
	}
}